

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O3

void chatra::emb::containers::byteArray_remove(Ct *ct)

{
  __atomic_flag_data_type _Var1;
  pointer puVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  pointer puVar5;
  pointer __src;
  ByteArrayData *this;
  
  iVar3 = (*ct->_vptr_NativeCallContext[5])();
  this = (ByteArrayData *)CONCAT44(extraout_var,iVar3);
  do {
    LOCK();
    _Var1 = (this->super_ByteArray).lock.flag.super___atomic_flag_base._M_i;
    (this->super_ByteArray).lock.flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  sVar4 = ByteArrayData::fetchIndex(this,ct,0,false);
  (*ct->_vptr_NativeCallContext[0xe])
            (ct,(ulong)(this->super_ByteArray).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar4]);
  puVar2 = (this->super_ByteArray).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->super_ByteArray).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __src = puVar2 + sVar4 + 1;
  if (__src != puVar5) {
    memmove(puVar2 + sVar4,__src,(long)puVar5 - (long)__src);
    puVar5 = (this->super_ByteArray).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->super_ByteArray).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar5 + -1;
  (this->super_ByteArray).lock.flag.super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

static void byteArray_remove(Ct& ct) {
	auto* self = ct.self<ByteArrayData>();
	std::lock_guard<SpinLock> lock(self->lock);
	auto position = self->fetchIndex(ct, 0, false);
	ct.set(self->data[position]);
	self->data.erase(self->data.cbegin() + position);
}